

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus
DecodeMemMultipleWritebackInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  DecodeStatus DVar4;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  DecodeStatus DVar5;
  uint Register;
  
  if (Insn >> 0x1c == 0xf) {
    uVar2 = MCInst_getOpcode(Inst);
    DVar5 = MCDisassembler_Fail;
    switch(uVar2) {
    case 0x8e:
      uVar2 = 0x118;
      break;
    case 0x8f:
      uVar2 = 0x119;
      break;
    case 0x90:
      uVar2 = 0x11a;
      break;
    case 0x91:
      uVar2 = 0x11b;
      break;
    case 0x92:
      uVar2 = 0x11c;
      break;
    case 0x93:
      goto switchD_0014f010_caseD_93;
    case 0x94:
      uVar2 = 0x11d;
      break;
    case 0x95:
      uVar2 = 0x11e;
      break;
    case 0x96:
      uVar2 = 0x11f;
      break;
    default:
      switch(uVar2) {
      case 0x195:
        uVar2 = 0x171;
        break;
      case 0x196:
        uVar2 = 0x172;
        break;
      case 0x197:
        uVar2 = 0x173;
        break;
      case 0x198:
        uVar2 = 0x174;
        break;
      case 0x199:
        uVar2 = 0x175;
        break;
      case 0x19a:
        uVar2 = 0x176;
        break;
      case 0x19b:
        uVar2 = 0x177;
        break;
      case 0x19c:
        uVar2 = 0x178;
        break;
      default:
        goto switchD_0014f010_caseD_93;
      }
    }
    MCInst_setOpcode(Inst,uVar2);
    if ((Insn >> 0x14 & 1) == 0) {
      if ((Insn >> 0x16 & 1) == 0) {
        return MCDisassembler_Fail;
      }
      MCOperand_CreateImm0(Inst,(ulong)(Insn & 0xf));
    }
    else {
      MCOperand_CreateImm0(Inst,*(int64_t *)(&DAT_001ce570 + (Insn >> 0x14 & 0x18)));
      MCOperand_CreateReg0
                (Inst,(uint)*(ushort *)((long)GPRDecoderTable + (ulong)(Insn >> 0xf & 0x1e)));
    }
    DVar5 = MCDisassembler_Success;
  }
  else {
    Decoder_00 = GPRDecoderTable;
    uVar1 = *(ushort *)((long)GPRDecoderTable + (ulong)(Insn >> 0xf & 0x1e));
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder_00);
    DVar5 = MCDisassembler_Fail;
    if (((((DVar3 | 2) == MCDisassembler_Success) &&
         (DVar4 = DecodeRegListOperand(Inst,Insn & 0xffff,Address_01,Decoder_00), DVar5 = DVar4,
         DVar4 != MCDisassembler_Fail)) && (DVar5 = DVar3, DVar4 != MCDisassembler_Success)) &&
       (DVar5 = DVar4, DVar4 != MCDisassembler_SoftFail)) {
      DVar5 = MCDisassembler_Fail;
    }
  }
switchD_0014f010_caseD_93:
  return DVar5;
}

Assistant:

static DecodeStatus DecodeMemMultipleWritebackInstruction(MCInst *Inst,
		unsigned Insn, uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reglist = fieldFromInstruction_4(Insn, 0, 16);

	if (pred == 0xF) {
		// Ambiguous with RFE and SRS
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDMDA:
				MCInst_setOpcode(Inst, ARM_RFEDA);
				break;
			case ARM_LDMDA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDA_UPD);
				break;
			case ARM_LDMDB:
				MCInst_setOpcode(Inst, ARM_RFEDB);
				break;
			case ARM_LDMDB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDB_UPD);
				break;
			case ARM_LDMIA:
				MCInst_setOpcode(Inst, ARM_RFEIA);
				break;
			case ARM_LDMIA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIA_UPD);
				break;
			case ARM_LDMIB:
				MCInst_setOpcode(Inst, ARM_RFEIB);
				break;
			case ARM_LDMIB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIB_UPD);
				break;
			case ARM_STMDA:
				MCInst_setOpcode(Inst, ARM_SRSDA);
				break;
			case ARM_STMDA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDA_UPD);
				break;
			case ARM_STMDB:
				MCInst_setOpcode(Inst, ARM_SRSDB);
				break;
			case ARM_STMDB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDB_UPD);
				break;
			case ARM_STMIA:
				MCInst_setOpcode(Inst, ARM_SRSIA);
				break;
			case ARM_STMIA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIA_UPD);
				break;
			case ARM_STMIB:
				MCInst_setOpcode(Inst, ARM_SRSIB);
				break;
			case ARM_STMIB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIB_UPD);
				break;
			default:
				return MCDisassembler_Fail;
		}

		// For stores (which become SRS's, the only operand is the mode.
		if (fieldFromInstruction_4(Insn, 20, 1) == 0) {
			// Check SRS encoding constraints
			if (!(fieldFromInstruction_4(Insn, 22, 1) == 1 &&
						fieldFromInstruction_4(Insn, 20, 1) == 0))
				return MCDisassembler_Fail;

			MCOperand_CreateImm0(Inst, fieldFromInstruction_4(Insn, 0, 4));
			return S;
		}

		return DecodeRFEInstruction(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail; // Tied
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeRegListOperand(Inst, reglist, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}